

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Select.hpp
# Opt level: O0

Gen<char> * __thiscall
rc::gen::oneOf<char,char,char>
          (Gen<char> *__return_storage_ptr__,gen *this,Gen<char> *gen,Gen<char> *gens,
          Gen<char> *gens_1)

{
  Gen<char> local_b8;
  Gen<char> local_90;
  Gen<char> local_68;
  OneOfGen<char> local_40;
  Gen<char> *local_28;
  Gen<char> *gens_local_1;
  Gen<char> *gens_local;
  Gen<char> *gen_local;
  
  local_28 = gens;
  gens_local_1 = gen;
  gens_local = (Gen<char> *)this;
  gen_local = __return_storage_ptr__;
  Gen<char>::Gen(&local_68,(Gen<char> *)this);
  Gen<char>::Gen(&local_90,gen);
  Gen<char>::Gen(&local_b8,gens);
  detail::OneOfGen<char>::OneOfGen<char,char,char>(&local_40,&local_68,&local_90,&local_b8);
  Gen<char>::Gen<rc::gen::detail::OneOfGen<char>,void>(__return_storage_ptr__,&local_40);
  detail::OneOfGen<char>::~OneOfGen(&local_40);
  Gen<char>::~Gen(&local_b8);
  Gen<char>::~Gen(&local_90);
  Gen<char>::~Gen(&local_68);
  return __return_storage_ptr__;
}

Assistant:

Gen<T> oneOf(Gen<T> gen, Gen<Ts>... gens) {
  return detail::OneOfGen<T>(std::move(gen), std::move(gens)...);
}